

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

bool __thiscall HEkk::debugNlaScalingOk(HEkk *this,HighsLp *lp)

{
  void *lp_scale;
  void *nla_scale;
  HSimplexNla *simplex_nla;
  bool ok;
  HighsLp *lp_local;
  HEkk *this_local;
  
  if (((lp->scale_).has_scaling & 1U) == 0) {
    ok = (this->simplex_nla_).scale_ == (HighsScale *)0x0;
  }
  else {
    ok = (this->simplex_nla_).scale_ == &lp->scale_;
  }
  return ok;
}

Assistant:

bool HEkk::debugNlaScalingOk(const HighsLp& lp) const {
  bool ok = true;
  assert(this->status_.has_nla);
  const HSimplexNla& simplex_nla = this->simplex_nla_;
  if (lp.scale_.has_scaling) {
    // The LP has scaling, so ensure that the simplex NLA has its scaling
    void* nla_scale = (void*)simplex_nla.scale_;
    void* lp_scale = (void*)(&lp.scale_);
    ok = nla_scale == lp_scale;
  } else {
    // The LP has no scaling, so ensure that the simplex NLA has no scaling
    ok = !simplex_nla.scale_;
  }
  assert(ok);
  return ok;
}